

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

ex_ex * eval_tab(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  ex_ex *peVar1;
  bool bVar2;
  fts_symbol_t ptStack_50;
  int notable;
  char *tbl;
  ex_ex arg;
  int idx_local;
  ex_ex *optr_local;
  ex_ex *eptr_local;
  expr *expr_local;
  
  arg.ex_end._4_4_ = idx;
  memset(&tbl,0,0x18);
  ptStack_50 = (fts_symbol_t)0x0;
  bVar2 = false;
  if (eptr->ex_type == 0xd) {
    if (expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int == 0) {
      if ((expr->exp_error & 8U) == 0) {
        post("expr: syntax error: no string for inlet %d",(eptr->ex_cont).v_int + 1);
        post("expr: No more table errors will be reported");
        post("expr: till the next reset");
        expr->exp_error = expr->exp_error | 8;
      }
      bVar2 = true;
    }
    else {
      ptStack_50 = (fts_symbol_t)expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec;
    }
  }
  else if (eptr->ex_type == 5) {
    ptStack_50 = (fts_symbol_t)(eptr->ex_cont).v_vec;
    bVar2 = ptStack_50 == (fts_symbol_t)0x0;
    if (bVar2) {
      post("expr: abstraction argument for table not set");
    }
  }
  else {
    pd_error(expr,"expr: eval_tbl: bad type %ld\n",eptr->ex_type);
    bVar2 = true;
  }
  arg.ex_cont.v_int = 0;
  tbl = (char *)0x0;
  peVar1 = ex_eval(expr,eptr + 1,(ex_ex *)&tbl,arg.ex_end._4_4_);
  if (peVar1 != (ex_ex *)0x0) {
    optr->ex_type = 1;
    (optr->ex_cont).v_int = 0;
    if (!bVar2) {
      max_ex_tab(expr,ptStack_50,(ex_ex *)&tbl,optr);
    }
    if (arg.ex_cont.v_int == 0xf) {
      free(tbl);
    }
  }
  return peVar1;
}

Assistant:

struct ex_ex *
eval_tab(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
{
        struct ex_ex arg = { 0 };
        char *tbl = (char *) 0;
        int notable = 0;

        if (eptr->ex_type == ET_SI) {
                if (!expr->exp_var[eptr->ex_int].ex_ptr) {
                        if (!(expr->exp_error & EE_NOTABLE)) {
                                post("expr: syntax error: no string for inlet %d",
                                                                                                                        eptr->ex_int + 1);
                                post("expr: No more table errors will be reported");
                                post("expr: till the next reset");
                                expr->exp_error |= EE_NOTABLE;
                        }
                        notable++;
                } else
                        tbl = (char *) expr->exp_var[eptr->ex_int].ex_ptr;
        } else if (eptr->ex_type == ET_TBL) {
                tbl = (char *) eptr->ex_ptr;
                if (!tbl) {
                        post("expr: abstraction argument for table not set");
                        notable++;
                }

        } else {
                post_error((fts_object_t *) expr,"expr: eval_tbl: bad type %ld\n",eptr->ex_type);
                notable++;

        }
        arg.ex_type = 0;
        arg.ex_int = 0;
        if (!(eptr = ex_eval(expr, ++eptr, &arg, idx)))
                return (eptr);

        optr->ex_type = ET_INT;
        optr->ex_int = 0;
        if (!notable)
                (void)max_ex_tab(expr, (t_symbol *)tbl, &arg, optr);
        if (arg.ex_type == ET_VEC)
                fts_free(arg.ex_vec);
        return (eptr);
}